

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

Endpoint * __thiscall
helics::MessageFederateManager::registerDataSink(MessageFederateManager *this,string_view name)

{
  Endpoint **ppEVar1;
  reference pvVar2;
  RegistrationFailure *this_00;
  long lVar3;
  Endpoint *pEVar4;
  string_view message;
  optional<unsigned_long> oVar5;
  InterfaceHandle handle;
  handle datHandle;
  handle eptHandle;
  InterfaceHandle local_64;
  handle local_60;
  handle local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = name._M_str;
  local_30._M_len = name._M_len;
  local_64.hid = (*this->coreObject->_vptr_Core[0x38])
                           (this->coreObject,(ulong)(uint)(this->fedID).fid,local_30._M_len,
                            local_30._M_str);
  if (local_64.hid != -1700000000) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_48,&this->mLocalEndpoints);
    oVar5 = gmlc::containers::
            DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::MessageFederate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
                      ((DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
                        *)local_48.data,name,&local_64,&this->mFed,&local_30,&local_64);
    if (((undefined1  [16])
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      lVar3 = (long)((local_48.data)->dataStorage).bsize;
      ppEVar1 = ((local_48.data)->dataStorage).dataptr;
      if (lVar3 == 0) {
        pEVar4 = ppEVar1[(((local_48.data)->dataStorage).csize >> 5) - 1] + 0x1f;
      }
      else {
        pEVar4 = ppEVar1[((local_48.data)->dataStorage).dataSlotIndex] + lVar3 + -1;
      }
      pEVar4->receiveOnly = true;
      gmlc::libguarded::
      shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::lock(&local_60,&this->eptData);
      pvVar2 = std::
               deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
               ::emplace_back<>(local_60.data);
      pEVar4->dataReference = pvVar2;
      local_60.data = (pointer)0x0;
      if (local_60.m_handle_lock._M_owns == true) {
        std::unique_lock<std::shared_mutex>::unlock(&local_60.m_handle_lock);
      }
      pEVar4->referenceIndex =
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._0_4_;
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      return pEVar4;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  }
  this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Data Sink";
  message._M_len = 0x1c;
  RegistrationFailure::RegistrationFailure(this_00,message);
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Endpoint& MessageFederateManager::registerDataSink(std::string_view name)
{
    auto handle = coreObject->registerDataSink(fedID, name);
    if (handle.isValid()) {
        auto eptHandle = mLocalEndpoints.lock();
        auto loc = eptHandle->insert(name, handle, mFed, name, handle);
        if (loc) {
            auto& ref = eptHandle->back();
            ref.receiveOnly = true;
            auto datHandle = eptData.lock();
            auto& edat = datHandle->emplace_back();

            // non-owning pointer
            ref.dataReference = &edat;
            datHandle.unlock();
            ref.referenceIndex = static_cast<int>(*loc);

            return ref;
        }
    }
    throw(RegistrationFailure("Unable to register Data Sink"));
}